

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

string * __thiscall COutPoint::ToString_abi_cxx11_(string *__return_storage_ptr__,COutPoint *this)

{
  uint *in_R8;
  long in_FS_OFFSET;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256u>::ToString_abi_cxx11_(&local_60,(base_blob<256u> *)this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_40,&local_60,0,10);
  tinyformat::format<std::__cxx11::string,unsigned_int>
            (__return_storage_ptr__,(tinyformat *)"COutPoint(%s, %u)",(char *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->n,in_R8);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string COutPoint::ToString() const
{
    return strprintf("COutPoint(%s, %u)", hash.ToString().substr(0,10), n);
}